

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::sendCommand(FederateState *this,ActionMessage *command)

{
  pointer pcVar1;
  size_type sVar2;
  utilities *this_00;
  double t;
  string_view quoteChars;
  bool bVar3;
  LogLevels level;
  int iVar4;
  size_type sVar5;
  string *psVar6;
  unsigned_long newSize;
  byte *pbVar7;
  char *pcVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  LogManager *pLVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  ulong uVar12;
  basic_string_view<char,_std::char_traits<char>_> message;
  string_view trimCharacters;
  string_view line;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view fmt;
  string_view str;
  string_view str_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view str_01;
  string_view str_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  string_view fmt_00;
  string_view str_03;
  string_view str_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  string_view logMessageSource;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  string_view V;
  string_view V_00;
  string_view level_00;
  format_args args;
  format_args args_00;
  string_viewVector res;
  string local_120;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  ActionMessage bye;
  pointer local_38;
  size_type sStack_30;
  char *extraout_RDX;
  
  pbVar7 = (command->payload).heap;
  local_100._M_str = (char *)pbVar7;
  local_100._M_len = (command->payload).bufferSize;
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,'#',0);
  if (sVar5 != 0xffffffffffffffff) {
    local_100 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_100,0,sVar5 - 1);
  }
  trimCharacters._M_str = (char *)pbVar7;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_100,(string_view *)0x4,trimCharacters);
  aVar11.values_ = (value<fmt::v11::context> *)0x0;
  quoteChars._M_str = (char *)0x33aeef;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x1;
  line._M_len = (size_t)local_100._M_str;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&res,(string_viewOps *)local_100._M_len,line,(string_view)ZEXT816(0x33adf7),quoteChars,
             (delimiter_compression)
             res.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if ((basic_string_view<char,_std::char_traits<char>_> *)
      CONCAT44(res.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_,
               (delimiter_compression)
               res.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) ==
      res.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00273005;
  __y._M_str = "terminate";
  __y._M_len = 9;
  bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(res.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (delimiter_compression)
                                    res.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start),__y);
  if (bVar3) {
LAB_00272d77:
    if (this->mAllowRemoteControl == true) {
      if (this->mParent == (CommonCore *)0x0) goto LAB_00273005;
      ActionMessage::ActionMessage(&bye,cmd_disconnect);
      bye.dest_id.gid = (this->global_id)._M_i.gid;
      bye.source_id.gid = bye.dest_id.gid;
      BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
    }
    else {
      if (this->mParent == (CommonCore *)0x0) goto LAB_00273005;
      ActionMessage::ActionMessage(&bye,command->messageAction);
      local_38 = (this->name)._M_dataplus._M_p;
      sStack_30 = (this->name)._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x28;
      args.field_1.args_ = aVar11.args_;
      args.desc_ = (unsigned_long_long)&local_38;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_120,(v11 *)"log {} does not allow remote termination",fmt,args);
      SmallBuffer::operator=(&bye.payload,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      bye.dest_id.gid = (command->source_id).gid;
      bye.source_id.gid = (this->global_id)._M_i.gid;
      psVar6 = ActionMessage::getString_abi_cxx11_(command,1);
      str._M_str = (psVar6->_M_dataplus)._M_p;
      str._M_len = psVar6->_M_string_length;
      ActionMessage::setString(&bye,0,str);
      str_00._M_str = (this->name)._M_dataplus._M_p;
      str_00._M_len = (this->name)._M_string_length;
      ActionMessage::setString(&bye,1,str_00);
      BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
    }
  }
  else {
    __y_00._M_str = "halt";
    __y_00._M_len = 4;
    bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (delimiter_compression)
                                      res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start),__y_00);
    if (bVar3) goto LAB_00272d77;
    __y_01._M_str = "echo";
    __y_01._M_len = 4;
    bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (delimiter_compression)
                                      res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start),__y_01);
    if (bVar3) {
      if (this->mParent == (CommonCore *)0x0) goto LAB_00273005;
      ActionMessage::ActionMessage(&bye,command->messageAction);
      SmallBuffer::operator=(&bye.payload,(char (*) [11])"echo_reply");
      bye.dest_id.gid = (command->source_id).gid;
      bye.source_id.gid = (this->global_id)._M_i.gid;
      psVar6 = ActionMessage::getString_abi_cxx11_(command,1);
      str_01._M_str = (psVar6->_M_dataplus)._M_p;
      str_01._M_len = psVar6->_M_string_length;
      ActionMessage::setString(&bye,0,str_01);
      str_02._M_str = (this->name)._M_dataplus._M_p;
      str_02._M_len = (this->name)._M_string_length;
      ActionMessage::setString(&bye,1,str_02);
      BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
    }
    else {
      __y_02._M_str = "command_status";
      __y_02._M_len = 0xe;
      bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(res.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (delimiter_compression)
                                        res.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start),__y_02);
      if (!bVar3) {
        __y_03._M_str = "logbuffer";
        __y_03._M_len = 9;
        bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(res.
                                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (delimiter_compression)
                                          res.
                                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start),__y_03);
        if (bVar3) {
          uVar12 = (long)res.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   CONCAT44(res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (delimiter_compression)
                            res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if (uVar12 < 0x11) {
            pLVar10 = (this->mLogManager)._M_t.
                      super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                      .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
          }
          else {
            __y_06._M_str = "stop";
            __y_06._M_len = 4;
            pcVar8 = "stop";
            bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     (CONCAT44(res.
                                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (delimiter_compression)
                                               res.
                                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) + 0x10),
                                    __y_06);
            pLVar10 = (this->mLogManager)._M_t.
                      super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                      .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
            if (!bVar3) {
              V._M_str = (char *)0xa;
              V._M_len = *(size_t *)
                          (CONCAT44(res.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (delimiter_compression)
                                    res.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + 0x18);
              newSize = gmlc::utilities::numeric_conversion<unsigned_long>
                                  (*(utilities **)
                                    (CONCAT44(res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (delimiter_compression)
                                              res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) + 0x10),V,
                                   (unsigned_long)pcVar8);
              LogBuffer::resize(&pLVar10->mLogBuffer,newSize);
              goto LAB_00273005;
            }
          }
          LogBuffer::enable(&pLVar10->mLogBuffer,uVar12 < 0x11);
          goto LAB_00273005;
        }
        __y_04._M_str = "remotelog";
        __y_04._M_len = 9;
        bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(res.
                                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (delimiter_compression)
                                          res.
                                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start),__y_04);
        if (!bVar3) {
          __y_07._M_str = "timeout_monitor";
          __y_07._M_len = 0xf;
          bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT44(res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            (delimiter_compression)
                                            res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start),__y_07);
          if (bVar3) {
            setProperty(this,0xa1,(Time)(command->actionTime).internalTimeCode);
            goto LAB_00273005;
          }
          __y_08._M_str = "log";
          __y_08._M_len = 3;
          bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT44(res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            (delimiter_compression)
                                            res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start),__y_08);
          if (bVar3) {
            psVar6 = ActionMessage::getString_abi_cxx11_(command,1);
            pcVar1 = (psVar6->_M_dataplus)._M_p;
            sVar2 = psVar6->_M_string_length;
            bye._0_8_ = (command->payload).bufferSize;
            bye._8_8_ = (command->payload).heap;
            message = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                ((basic_string_view<char,_std::char_traits<char>_> *)&bye,4,
                                 0xffffffffffffffff);
            logMessageSource._M_str = pcVar1;
            logMessageSource._M_len = sVar2;
            logMessage(this,6,logMessageSource,(string_view)message,false);
            goto LAB_00273005;
          }
          __y_09._M_str = "set";
          __y_09._M_len = 3;
          bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT44(res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            (delimiter_compression)
                                            res.
                                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start),__y_09);
          pbVar9 = (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (delimiter_compression)
                            res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if ((bVar3) &&
             (0x20 < (ulong)((long)res.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9))) {
            __y_10._M_str = "barrier";
            __y_10._M_len = 7;
            bVar3 = std::operator==(pbVar9[1],__y_10);
            if (bVar3) {
              ActionMessage::ActionMessage(&bye,cmd_time_barrier);
              bye.dest_id.gid = (this->global_id)._M_i.gid;
              t = gmlc::utilities::numeric_conversionComplete<double>
                            (*(string_view *)
                              (CONCAT44(res.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (delimiter_compression)
                                        res.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + 0x20),0.0);
              bye.actionTime.internalTimeCode = count_time<9,_long>::convert(t);
              if (0x30 < (ulong)((long)res.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                CONCAT44(res.
                                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (delimiter_compression)
                                         res.
                                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start))) {
                iVar4 = gmlc::utilities::numeric_conversionComplete<int>
                                  (*(string_view *)
                                    (CONCAT44(res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (delimiter_compression)
                                              res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) + 0x30),0);
                bye.messageID = iVar4;
              }
              gmlc::containers::
              BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
              push<helics::ActionMessage&>
                        ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                         &this->queue,&bye);
              goto LAB_00272ffb;
            }
            pbVar9 = (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(res.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (delimiter_compression)
                              res.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          }
          __y_11._M_str = "clear";
          __y_11._M_len = 5;
          bVar3 = std::operator==(*pbVar9,__y_11);
          if ((bVar3) &&
             (0x10 < (ulong)((long)res.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            CONCAT44(res.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (delimiter_compression)
                                     res.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)))) {
            __y_12._M_str = "barrier";
            __y_12._M_len = 7;
            bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     (CONCAT44(res.
                                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (delimiter_compression)
                                               res.
                                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) + 0x10),
                                    __y_12);
            if (bVar3) {
              ActionMessage::ActionMessage(&bye,cmd_time_barrier_clear);
              bye.dest_id.gid = (this->global_id)._M_i.gid;
              if (0x20 < (ulong)((long)res.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                CONCAT44(res.
                                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (delimiter_compression)
                                         res.
                                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start))) {
                iVar4 = gmlc::utilities::numeric_conversionComplete<int>
                                  (*(string_view *)
                                    (CONCAT44(res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (delimiter_compression)
                                              res.
                                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) + 0x20),0);
                bye.messageID = iVar4;
              }
              gmlc::containers::
              BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
              push<helics::ActionMessage&>
                        ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                         &this->queue,&bye);
              goto LAB_00272ffb;
            }
          }
          psVar6 = ActionMessage::getString_abi_cxx11_(command,1);
          gmlc::containers::
          BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
          ::
          emplace<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&>
                    ((BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
                      *)&this->commandQueue,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_100,psVar6);
          goto LAB_00273005;
        }
        if ((ulong)((long)res.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   CONCAT44(res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (delimiter_compression)
                            res.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) < 0x11) {
          pLVar10 = (this->mLogManager)._M_t.
                    super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                    .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
          iVar4 = pLVar10->consoleLogLevel;
LAB_00273139:
          LogManager::updateRemote(pLVar10,(GlobalFederateId)(command->source_id).gid,iVar4);
        }
        else {
          __y_05._M_str = "stop";
          __y_05._M_len = 4;
          iVar4 = 0x3382ab;
          bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   (CONCAT44(res.
                                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (delimiter_compression)
                                             res.
                                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) + 0x10),
                                  __y_05);
          if (bVar3) {
            pLVar10 = (this->mLogManager)._M_t.
                      super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                      .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
            iVar4 = -4;
            goto LAB_00273139;
          }
          this_00 = *(utilities **)
                     (CONCAT44(res.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (delimiter_compression)
                               res.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x10);
          pcVar8 = *(char **)(CONCAT44(res.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (delimiter_compression)
                                       res.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) + 0x18);
          if ((int)*pcVar8 - 0x30U < 10) {
            V_00._M_str._0_4_ =
                 ((this->mLogManager)._M_t.
                  super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                  .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->consoleLogLevel
            ;
            V_00._M_len = (size_t)pcVar8;
            V_00._M_str._4_4_ = 0;
            level = gmlc::utilities::numeric_conversion<int>(this_00,V_00,iVar4);
          }
          else {
            level_00._M_str = extraout_RDX;
            level_00._M_len = (size_t)pcVar8;
            level = logLevelFromString((helics *)this_00,level_00);
          }
          LogManager::updateRemote
                    ((this->mLogManager)._M_t.
                     super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                     .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl,
                     (GlobalFederateId)(command->source_id).gid,level);
        }
        this->maxLogLevel =
             (((this->mLogManager)._M_t.
               super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
               .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->maxLogLevel).
             super___atomic_base<int>._M_i;
        goto LAB_00273005;
      }
      if (this->mParent == (CommonCore *)0x0) goto LAB_00273005;
      ActionMessage::ActionMessage(&bye,command->messageAction);
      local_38 = (pointer)gmlc::containers::
                          BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                          ::size(&this->commandQueue);
      fmt_00.size_ = 4;
      fmt_00.data_ = (char *)0x19;
      args_00.field_1.args_ = aVar11.args_;
      args_00.desc_ = (unsigned_long_long)&local_38;
      ::fmt::v11::vformat_abi_cxx11_(&local_120,(v11 *)"\"{} unprocessed commands\"",fmt_00,args_00)
      ;
      SmallBuffer::operator=(&bye.payload,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      bye.dest_id.gid = (command->source_id).gid;
      bye.source_id.gid = (this->global_id)._M_i.gid;
      psVar6 = ActionMessage::getString_abi_cxx11_(command,1);
      str_03._M_str = (psVar6->_M_dataplus)._M_p;
      str_03._M_len = psVar6->_M_string_length;
      ActionMessage::setString(&bye,0,str_03);
      str_04._M_str = (this->name)._M_dataplus._M_p;
      str_04._M_len = (this->name)._M_string_length;
      ActionMessage::setString(&bye,1,str_04);
      BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
    }
  }
LAB_00272ffb:
  ActionMessage::~ActionMessage(&bye);
LAB_00273005:
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&res.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void FederateState::sendCommand(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " ",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return;
    }

    if (res[0] == "terminate" || res[0] == "halt") {
        if (mAllowRemoteControl) {
            if (mParent != nullptr) {
                ActionMessage bye(CMD_DISCONNECT);
                bye.source_id = global_id.load();
                bye.dest_id = bye.source_id;
                mParent->addActionMessage(bye);
            }
        } else {
            if (mParent != nullptr) {
                ActionMessage response(command.action());
                response.payload =
                    fmt::format("log {} does not allow remote termination", getIdentifier());
                response.dest_id = command.source_id;
                response.source_id = global_id.load();
                response.setString(targetStringLoc, command.getString(sourceStringLoc));
                response.setString(sourceStringLoc, getIdentifier());

                mParent->addActionMessage(std::move(response));
            }
        }
    } else if (res[0] == "echo") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = "echo_reply";
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "command_status") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = fmt::format("\"{} unprocessed commands\"", commandQueue.size());
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLevel{HELICS_LOG_LEVEL_NO_PRINT};
                if (isdigit(res[1][0]) != 0) {
                    newLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1],
                                                                 mLogManager->getConsoleLevel());
                } else {
                    newLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel = mLogManager->getMaxLevel();
    } else if (res[0] == "timeout_monitor") {
        setProperty(defs::Properties::GRANT_TIMEOUT, command.actionTime);
    } else if (res[0] == "log") {
        logMessage(HELICS_LOG_LEVEL_SUMMARY,
                   command.getString(sourceStringLoc),
                   command.payload.to_string().substr(4));
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.dest_id = global_id;
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        queue.push(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        barrier.dest_id = global_id;
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        queue.push(barrier);
    } else {
        commandQueue.emplace(cmd, command.getString(sourceStringLoc));
    }
}